

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Payload>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Payload *__first;
  Payload *__last;
  StreamReader *pSVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char c;
  char nc;
  bool triple_deliminated;
  char local_191;
  undefined4 local_190;
  undefined4 local_18c;
  Payload local_188;
  string local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  __first = (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_start;
  __last = (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(__first,__last);
    (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    local_18c = (undefined4)CONCAT71(in_register_00000011,end_symbol);
    local_188.asset_path.asset_path_._M_dataplus._M_p =
         (pointer)&local_188.asset_path.asset_path_.field_2;
    local_188.asset_path.asset_path_._M_string_length = 0;
    local_188.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
    local_188.asset_path.resolved_path_._M_dataplus._M_p =
         (pointer)&local_188.asset_path.resolved_path_.field_2;
    local_188.asset_path.resolved_path_._M_string_length = 0;
    local_188.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_188.prim_path._prim_part._M_dataplus._M_p =
         (pointer)&local_188.prim_path._prim_part.field_2;
    local_188.prim_path._prim_part._M_string_length = 0;
    local_188.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
    local_188.prim_path._prop_part._M_dataplus._M_p =
         (pointer)&local_188.prim_path._prop_part.field_2;
    local_188.prim_path._prop_part._M_string_length = 0;
    local_188.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
    local_188.prim_path._variant_part._M_dataplus._M_p =
         (pointer)&local_188.prim_path._variant_part.field_2;
    local_188.prim_path._variant_part._M_string_length = 0;
    local_188.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
    local_188.prim_path._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_188.prim_path._variant_selection_part.field_2;
    local_188.prim_path._variant_selection_part._M_string_length = 0;
    local_188.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_188.prim_path._variant_part_str._M_dataplus._M_p =
         (pointer)&local_188.prim_path._variant_part_str.field_2;
    local_188.prim_path._variant_part_str._M_string_length = 0;
    local_188.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_188.prim_path._element.field_2;
    local_188.prim_path._element._M_string_length = 0;
    local_188.prim_path._element.field_2._M_local_buf[0] = '\0';
    local_188.prim_path._path_type.has_value_ = false;
    local_188.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_188.prim_path._valid = false;
    local_188.layerOffset._offset = 0.0;
    local_188.layerOffset._scale = 1.0;
    local_188.prim_path._element._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = ParsePayload(this,&local_188,(bool *)&local_68);
    local_190 = (undefined4)CONCAT71(in_register_00000031,sep);
    if (bVar3) {
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                (result,&local_188);
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Not starting with the value of requested type.\n","");
      PushError(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    paVar7 = &local_188.asset_path.asset_path_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.prim_path._element._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.prim_path._element._M_dataplus._M_p,
                      CONCAT71(local_188.prim_path._element.field_2._M_allocated_capacity._1_7_,
                               local_188.prim_path._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.prim_path._variant_part_str._M_dataplus._M_p !=
        &local_188.prim_path._variant_part_str.field_2) {
      operator_delete(local_188.prim_path._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_188.prim_path._variant_part_str.field_2._M_allocated_capacity.
                               _1_7_,local_188.prim_path._variant_part_str.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.prim_path._variant_selection_part._M_dataplus._M_p !=
        &local_188.prim_path._variant_selection_part.field_2) {
      operator_delete(local_188.prim_path._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_188.prim_path._variant_selection_part.field_2.
                               _M_allocated_capacity._1_7_,
                               local_188.prim_path._variant_selection_part.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.prim_path._variant_part._M_dataplus._M_p !=
        &local_188.prim_path._variant_part.field_2) {
      operator_delete(local_188.prim_path._variant_part._M_dataplus._M_p,
                      CONCAT71(local_188.prim_path._variant_part.field_2._M_allocated_capacity._1_7_
                               ,local_188.prim_path._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.prim_path._prop_part._M_dataplus._M_p !=
        &local_188.prim_path._prop_part.field_2) {
      operator_delete(local_188.prim_path._prop_part._M_dataplus._M_p,
                      CONCAT71(local_188.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_188.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.prim_path._prim_part._M_dataplus._M_p !=
        &local_188.prim_path._prim_part.field_2) {
      operator_delete(local_188.prim_path._prim_part._M_dataplus._M_p,
                      CONCAT71(local_188.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_188.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.asset_path.resolved_path_._M_dataplus._M_p !=
        &local_188.asset_path.resolved_path_.field_2) {
      operator_delete(local_188.asset_path.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_188.asset_path.resolved_path_.field_2._M_allocated_capacity.
                               _1_7_,local_188.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.asset_path.asset_path_._M_dataplus._M_p != paVar7) {
      operator_delete(local_188.asset_path.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_188.asset_path.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_188.asset_path.asset_path_.field_2._M_local_buf[0]) + 1);
    }
    if (bVar3) {
      local_48 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0x3ff00000;
      do {
        pSVar2 = this->_sr;
        if ((pSVar2->length_ <= pSVar2->idx_) || (pSVar2->binary_[pSVar2->idx_] == '\0'))
        goto LAB_00383f7e;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,&local_191);
        cVar4 = (char)local_190;
        if (!bVar3) {
          return false;
        }
        if (local_191 == cVar4) {
          bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = LookChar1(this,(char *)&local_188);
          if (!bVar3) {
            return false;
          }
          iVar6 = 3;
          if ((char)local_188.asset_path.asset_path_._M_dataplus._M_p != (char)local_18c) {
            cVar4 = (char)local_190;
            goto LAB_00383d17;
          }
        }
        else {
LAB_00383d17:
          if (local_191 != cVar4) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar5 = pSVar2->idx_ - 1, uVar5 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar5;
            }
            goto LAB_00383f7e;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          local_188.asset_path.asset_path_._M_string_length = 0;
          local_188.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
          local_188.asset_path.resolved_path_._M_dataplus._M_p =
               (pointer)&local_188.asset_path.resolved_path_.field_2;
          local_188.asset_path.resolved_path_._M_string_length = 0;
          local_188.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._prim_part._M_dataplus._M_p =
               (pointer)&local_188.prim_path._prim_part.field_2;
          local_188.prim_path._prim_part._M_string_length = 0;
          local_188.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._prop_part._M_dataplus._M_p =
               (pointer)&local_188.prim_path._prop_part.field_2;
          local_188.prim_path._prop_part._M_string_length = 0;
          local_188.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._variant_part._M_dataplus._M_p =
               (pointer)&local_188.prim_path._variant_part.field_2;
          local_188.prim_path._variant_part._M_string_length = 0;
          local_188.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._variant_selection_part._M_dataplus._M_p =
               (pointer)&local_188.prim_path._variant_selection_part.field_2;
          local_188.prim_path._variant_selection_part._M_string_length = 0;
          local_188.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._variant_part_str._M_dataplus._M_p =
               (pointer)&local_188.prim_path._variant_part_str.field_2;
          local_188.prim_path._variant_part_str._M_string_length = 0;
          local_188.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._element._M_string_length = 0;
          local_188.prim_path._element.field_2._M_local_buf[0] = '\0';
          local_188.prim_path._path_type.has_value_ = false;
          local_188.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_188.prim_path._valid = false;
          local_188.layerOffset._offset = (double)CONCAT44(uStack_44,local_48);
          local_188.layerOffset._scale = (double)CONCAT44(uStack_3c,uStack_40);
          local_188.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar7;
          local_188.prim_path._element._M_dataplus._M_p = (pointer)paVar1;
          bVar3 = ParsePayload(this,&local_188,(bool *)&local_68);
          iVar6 = 3;
          if (bVar3) {
            ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                      (result,&local_188);
            iVar6 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.prim_path._element._M_dataplus._M_p != paVar1) {
            operator_delete(local_188.prim_path._element._M_dataplus._M_p,
                            CONCAT71(local_188.prim_path._element.field_2._M_allocated_capacity.
                                     _1_7_,local_188.prim_path._element.field_2._M_local_buf[0]) + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.prim_path._variant_part_str._M_dataplus._M_p !=
              &local_188.prim_path._variant_part_str.field_2) {
            operator_delete(local_188.prim_path._variant_part_str._M_dataplus._M_p,
                            CONCAT71(local_188.prim_path._variant_part_str.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_188.prim_path._variant_part_str.field_2._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.prim_path._variant_selection_part._M_dataplus._M_p !=
              &local_188.prim_path._variant_selection_part.field_2) {
            operator_delete(local_188.prim_path._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(local_188.prim_path._variant_selection_part.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_188.prim_path._variant_selection_part.field_2.
                                     _M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.prim_path._variant_part._M_dataplus._M_p !=
              &local_188.prim_path._variant_part.field_2) {
            operator_delete(local_188.prim_path._variant_part._M_dataplus._M_p,
                            CONCAT71(local_188.prim_path._variant_part.field_2._M_allocated_capacity
                                     ._1_7_,local_188.prim_path._variant_part.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.prim_path._prop_part._M_dataplus._M_p !=
              &local_188.prim_path._prop_part.field_2) {
            operator_delete(local_188.prim_path._prop_part._M_dataplus._M_p,
                            CONCAT71(local_188.prim_path._prop_part.field_2._M_allocated_capacity.
                                     _1_7_,local_188.prim_path._prop_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.prim_path._prim_part._M_dataplus._M_p !=
              &local_188.prim_path._prim_part.field_2) {
            operator_delete(local_188.prim_path._prim_part._M_dataplus._M_p,
                            CONCAT71(local_188.prim_path._prim_part.field_2._M_allocated_capacity.
                                     _1_7_,local_188.prim_path._prim_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.asset_path.resolved_path_._M_dataplus._M_p !=
              &local_188.asset_path.resolved_path_.field_2) {
            operator_delete(local_188.asset_path.resolved_path_._M_dataplus._M_p,
                            CONCAT71(local_188.asset_path.resolved_path_.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_188.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.asset_path.asset_path_._M_dataplus._M_p != paVar7) {
            operator_delete(local_188.asset_path.asset_path_._M_dataplus._M_p,
                            CONCAT71(local_188.asset_path.asset_path_.field_2._M_allocated_capacity.
                                     _1_7_,local_188.asset_path.asset_path_.field_2._M_local_buf[0])
                            + 1);
          }
        }
      } while (iVar6 == 0);
      if (iVar6 != 1) {
LAB_00383f7e:
        if ((result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_188.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar7;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Empty array.\n","");
        PushError(this,(string *)&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.asset_path.asset_path_._M_dataplus._M_p != paVar7) {
          operator_delete(local_188.asset_path.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_188.asset_path.asset_path_.field_2._M_allocated_capacity.
                                   _1_7_,local_188.asset_path.asset_path_.field_2._M_local_buf[0]) +
                          1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}